

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O0

ParseNodeUni * __thiscall
Parser::ParseDestructuredObjectLiteral<true>
          (Parser *this,tokens declarationType,bool isDecl,bool topLevel)

{
  code *pcVar1;
  bool bVar2;
  charcount_t ichMin_00;
  charcount_t ichLim_00;
  undefined4 *puVar3;
  Scanner_t *pSVar4;
  ParseNodePtr pnodeMemberList_00;
  ParseNodeObjLit *pPVar5;
  ParseNodeObjLit *objectPatternNode;
  charcount_t ichLim;
  ParseNodePtr pnodeMemberList;
  charcount_t ichMin;
  bool topLevel_local;
  bool isDecl_local;
  tokens declarationType_local;
  Parser *this_local;
  
  if ((this->m_token).tk != tkLCurly) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x33e8,"(m_token.tk == tkLCurly)","m_token.tk == tkLCurly");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pSVar4 = GetScanner(this);
  ichMin_00 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(pSVar4);
  pSVar4 = GetScanner(this);
  Scanner<UTF8EncodingPolicyBase<false>_>::Scan(pSVar4);
  ichMin = declarationType;
  if (!isDecl) {
    ichMin = 0x52;
  }
  pnodeMemberList_00 = ParseMemberList<true>(this,(LPCOLESTR)0x0,(uint32 *)0x0,ichMin);
  pSVar4 = GetScanner(this);
  ichLim_00 = Scanner<UTF8EncodingPolicyBase<false>_>::IchLimTok(pSVar4);
  pPVar5 = CreateObjectPatternNode(this,pnodeMemberList_00,ichMin_00,ichLim_00,false);
  if ((this->m_token).tk != tkRCurly) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                       ,0x33f6,"(m_token.tk == tkRCurly)","m_token.tk == tkRCurly");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  return &pPVar5->super_ParseNodeUni;
}

Assistant:

ParseNodeUni * Parser::ParseDestructuredObjectLiteral(tokens declarationType, bool isDecl, bool topLevel/* = true*/)
{
    Assert(m_token.tk == tkLCurly);
    charcount_t ichMin = this->GetScanner()->IchMinTok();
    this->GetScanner()->Scan();

    if (!isDecl)
    {
        declarationType = tkLCurly;
    }
    ParseNodePtr pnodeMemberList = ParseMemberList<buildAST>(nullptr/*pNameHint*/, nullptr/*pHintLength*/, declarationType);

    charcount_t ichLim = this->GetScanner()->IchLimTok();

    ParseNodeObjLit * objectPatternNode = buildAST ? CreateObjectPatternNode(pnodeMemberList, ichMin, ichLim) : nullptr;

    Assert(m_token.tk == tkRCurly);
    return objectPatternNode;
}